

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_partial_sig_verify
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_pubnonce *pubnonce,secp256k1_pubkey *pubkey,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  secp256k1_fe *rzr;
  ulong uVar4;
  ulong uVar5;
  secp256k1_ge pkp;
  secp256k1_scalar e;
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_musig_session_internal session_i;
  secp256k1_gej tmp;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge nonce_pts [2];
  secp256k1_gej pkj;
  secp256k1_ge local_4a0;
  secp256k1_gej local_448;
  secp256k1_scalar local_3c8;
  undefined1 local_3a8 [64];
  secp256k1_musig_session_internal local_368;
  secp256k1_gej local_2e0;
  secp256k1_keyagg_cache_internal local_260;
  secp256k1_ge local_168 [2];
  secp256k1_gej local_b8;
  
  if (partial_sig == (secp256k1_musig_partial_sig *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_5();
  }
  else if (pubnonce == (secp256k1_musig_pubnonce *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_4();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_3();
  }
  else if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_2();
  }
  else {
    if (session != (secp256k1_musig_session *)0x0) {
      iVar1 = secp256k1_musig_session_load(ctx,&local_368,session);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_musig_pubnonce_load(ctx,local_168,pubnonce);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_effective_nonce(&local_448,local_168,&local_368.noncecoef);
      iVar1 = secp256k1_pubkey_load(ctx,&local_4a0,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_keyagg_cache_load(ctx,&local_260,keyagg_cache);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_musig_keyaggcoef_internal
                ((secp256k1_scalar *)(local_3a8 + 0x20),local_260.pks_hash,&local_4a0,
                 &local_260.second_pk);
      secp256k1_scalar_mul(&local_3c8,&local_368.challenge,(secp256k1_scalar *)(local_3a8 + 0x20));
      if (((uint)local_260.pk.y.n[0] & 1) != local_260.parity_acc) {
        secp256k1_scalar_negate(&local_3c8,&local_3c8);
      }
      iVar1 = secp256k1_musig_partial_sig_load(ctx,(secp256k1_scalar *)local_3a8,partial_sig);
      if (iVar1 == 0) {
        return 0;
      }
      rzr = (secp256k1_fe *)local_3a8;
      secp256k1_scalar_negate((secp256k1_scalar *)rzr,(secp256k1_scalar *)rzr);
      local_b8.infinity = local_4a0.infinity;
      local_b8.x.n[0] = local_4a0.x.n[0];
      local_b8.x.n[1] = local_4a0.x.n[1];
      local_b8.x.n[2] = local_4a0.x.n[2];
      local_b8.x.n[3] = local_4a0.x.n[3];
      local_b8.x.n[4] = local_4a0.x.n[4];
      local_b8.y.n[0] = local_4a0.y.n[0];
      local_b8.y.n[1] = local_4a0.y.n[1];
      local_b8.y.n[2] = local_4a0.y.n[2];
      local_b8.y.n[3] = local_4a0.y.n[3];
      local_b8.y.n[4] = local_4a0.y.n[4];
      local_b8.z.n[0] = 1;
      local_b8.z.n[1] = 0;
      local_b8.z.n[2] = 0;
      local_b8.z.n[3] = 0;
      local_b8.z.n[4] = 0;
      secp256k1_ecmult(&local_2e0,&local_b8,&local_3c8,(secp256k1_scalar *)rzr);
      if (local_368.fin_nonce_parity != 0) {
        uVar2 = (local_448.y.n[4] >> 0x30) * 0x1000003d1 + local_448.y.n[0];
        uVar3 = (uVar2 >> 0x34) + local_448.y.n[1];
        uVar4 = (long)(uint64_t *)local_448.y.n[2] + (uVar3 >> 0x34);
        uVar5 = (uVar4 >> 0x34) + local_448.y.n[3];
        local_448.y.n[0] = 0x3ffffbfffff0bc - (uVar2 & 0xfffffffffffff);
        local_448.y.n[1] = 0x3ffffffffffffc - (uVar3 & 0xfffffffffffff);
        rzr = (secp256k1_fe *)(0x3ffffffffffffc - (uVar4 & 0xfffffffffffff));
        local_448.y.n[3] = 0x3ffffffffffffc - (uVar5 & 0xfffffffffffff);
        local_448.y.n[4] = 0x3fffffffffffc - ((uVar5 >> 0x34) + (local_448.y.n[4] & 0xffffffffffff))
        ;
        local_448.y.n[2] = (uint64_t)rzr;
      }
      secp256k1_gej_add_var(&local_2e0,&local_2e0,&local_448,rzr);
      return local_2e0.infinity;
    }
    secp256k1_musig_partial_sig_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_musig_partial_sig_verify(const secp256k1_context* ctx, const secp256k1_musig_partial_sig *partial_sig, const secp256k1_musig_pubnonce *pubnonce, const secp256k1_pubkey *pubkey, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    secp256k1_scalar mu, e, s;
    secp256k1_gej pkj;
    secp256k1_ge nonce_pts[2];
    secp256k1_gej rj;
    secp256k1_gej tmp;
    secp256k1_ge pkp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(pubnonce != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        return 0;
    }

    if (!secp256k1_musig_pubnonce_load(ctx, nonce_pts, pubnonce)) {
        return 0;
    }
    /* Compute "effective" nonce rj = nonce_pts[0] + b*nonce_pts[1] */
    /* TODO: use multiexp to compute -s*G + e*mu*pubkey + nonce_pts[0] + b*nonce_pts[1] */
    secp256k1_effective_nonce(&rj, nonce_pts, &session_i.noncecoef);

    if (!secp256k1_pubkey_load(ctx, &pkp, pubkey)) {
        return 0;
    }
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    /* Multiplying the challenge by the KeyAgg coefficient is equivalent
     * to multiplying the signer's public key by the coefficient, except
     * much easier to do. */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pkp);
    secp256k1_scalar_mul(&e, &session_i.challenge, &mu);

    /* Negate e if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let g' = g⋅gacc mod n" and the multiplication "g'⋅e"
     * in the specification. */
    if (secp256k1_fe_is_odd(&cache_i.pk.y)
            != cache_i.parity_acc) {
        secp256k1_scalar_negate(&e, &e);
    }

    if (!secp256k1_musig_partial_sig_load(ctx, &s, partial_sig)) {
        return 0;
    }
    /* Compute -s*G + e*pkj + rj (e already includes the keyagg coefficient mu) */
    secp256k1_scalar_negate(&s, &s);
    secp256k1_gej_set_ge(&pkj, &pkp);
    secp256k1_ecmult(&tmp, &pkj, &e, &s);
    if (session_i.fin_nonce_parity) {
        secp256k1_gej_neg(&rj, &rj);
    }
    secp256k1_gej_add_var(&tmp, &tmp, &rj, NULL);

    return secp256k1_gej_is_infinity(&tmp);
}